

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O1

void __thiscall TextProviderString::reverse(TextProviderString *this)

{
  int *piVar1;
  _Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Var2;
  int iVar3;
  
  iVar3 = (*(this->super_TextProvider)._vptr_TextProvider[2])();
  if (((char)iVar3 != '\0') &&
     ((this->m_iterator).
      super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged == true)) {
    piVar1 = &(this->super_TextProvider).m_current_char_idx;
    *piVar1 = *piVar1 + -1;
    _Var2 = (this->m_iterator).
            super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload;
    (this->m_iterator).
    super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload = (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                   )((long)_Var2 + -1);
    (this->super_TextProvider).m_current_char = *(char *)((long)_Var2 + -1);
  }
  return;
}

Assistant:

void TextProviderString::reverse()
{
	if(is_valid() && m_iterator.has_value())
	{
		--m_current_char_idx;
		--m_iterator.value();
		m_current_char = *m_iterator.value();
	}
}